

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileGate.cpp
# Opt level: O2

bool __thiscall TileGate::updateNextState(TileGate *this)

{
  Direction DVar1;
  State SVar2;
  State SVar3;
  int iVar4;
  State SVar5;
  Vector2u *pVVar6;
  Board *pBVar7;
  Tile *pTVar8;
  int i;
  ulong uVar9;
  int numMiddle;
  uint uVar10;
  uint numInputs;
  State adjacentStates [4];
  Vector2u local_30;
  
  pVVar6 = Tile::getPosition(&this->super_Tile);
  SVar3 = DISCONNECTED;
  adjacentStates[0] = DISCONNECTED;
  if (pVVar6->y != 0) {
    pBVar7 = Tile::getBoardPtr(&this->super_Tile);
    pVVar6 = Tile::getPosition(&this->super_Tile);
    uVar10 = pVVar6->x;
    pVVar6 = Tile::getPosition(&this->super_Tile);
    local_30.y = pVVar6->y - 1;
    local_30.x = uVar10;
    pTVar8 = Board::getTile(pBVar7,&local_30);
    adjacentStates[0] = (*pTVar8->_vptr_Tile[7])(pTVar8,0);
  }
  pVVar6 = Tile::getPosition(&this->super_Tile);
  uVar10 = pVVar6->x;
  pBVar7 = Tile::getBoardPtr(&this->super_Tile);
  pVVar6 = Board::getSize(pBVar7);
  if (uVar10 < pVVar6->x - 1) {
    pBVar7 = Tile::getBoardPtr(&this->super_Tile);
    pVVar6 = Tile::getPosition(&this->super_Tile);
    uVar10 = pVVar6->x;
    pVVar6 = Tile::getPosition(&this->super_Tile);
    local_30.y = pVVar6->y;
    local_30.x = uVar10 + 1;
    pTVar8 = Board::getTile(pBVar7,&local_30);
    SVar3 = (*pTVar8->_vptr_Tile[7])(pTVar8,1);
  }
  adjacentStates[1] = SVar3;
  pVVar6 = Tile::getPosition(&this->super_Tile);
  uVar10 = pVVar6->y;
  pBVar7 = Tile::getBoardPtr(&this->super_Tile);
  pVVar6 = Board::getSize(pBVar7);
  SVar3 = DISCONNECTED;
  adjacentStates[2] = DISCONNECTED;
  if (uVar10 < pVVar6->y - 1) {
    pBVar7 = Tile::getBoardPtr(&this->super_Tile);
    pVVar6 = Tile::getPosition(&this->super_Tile);
    uVar10 = pVVar6->x;
    pVVar6 = Tile::getPosition(&this->super_Tile);
    local_30.y = pVVar6->y + 1;
    local_30.x = uVar10;
    pTVar8 = Board::getTile(pBVar7,&local_30);
    adjacentStates[2] = (*pTVar8->_vptr_Tile[7])(pTVar8,2);
  }
  pVVar6 = Tile::getPosition(&this->super_Tile);
  if (pVVar6->x != 0) {
    pBVar7 = Tile::getBoardPtr(&this->super_Tile);
    pVVar6 = Tile::getPosition(&this->super_Tile);
    uVar10 = pVVar6->x;
    pVVar6 = Tile::getPosition(&this->super_Tile);
    local_30.y = pVVar6->y;
    local_30.x = uVar10 - 1;
    pTVar8 = Board::getTile(pBVar7,&local_30);
    SVar3 = (*pTVar8->_vptr_Tile[7])(pTVar8,3);
  }
  SVar5 = MIDDLE;
  adjacentStates[3] = SVar3;
  DVar1 = (this->super_Tile)._direction;
  numInputs = 0;
  uVar10 = 0;
  iVar4 = 0;
  for (uVar9 = 0; uVar9 != 4; uVar9 = uVar9 + 1) {
    if ((DVar1 != uVar9) && (SVar3 = adjacentStates[uVar9], SVar3 != DISCONNECTED)) {
      numInputs = numInputs + 1;
      if (SVar3 == MIDDLE) {
        iVar4 = iVar4 + 1;
      }
      else if (SVar3 == HIGH) {
        uVar10 = uVar10 + 1;
      }
    }
  }
  numMiddle = 0;
  if (Board::enableExtraLogicStates != false) {
    numMiddle = iVar4;
  }
  if (this->_connectorChange != false) {
    SVar3 = adjacentStates[(int)(DVar1 + EAST) % 4];
    this->_rightConnector = SVar3 != DISCONNECTED;
    SVar2 = adjacentStates[(int)(DVar1 + WEST) % 4];
    this->_leftConnector = SVar2 != DISCONNECTED;
    if (((*(int *)&(this->super_Tile).field_0x24 < 3) && (SVar3 != DISCONNECTED)) &&
       (SVar2 != DISCONNECTED)) {
      this->_rightConnector = false;
      this->_leftConnector = false;
    }
    this->_connectorChange = false;
    (*(this->super_Tile)._vptr_Tile[8])(this,1,0);
  }
  switch(*(undefined4 *)&(this->super_Tile).field_0x24) {
  case 0:
    if (numInputs == 1) {
      if (uVar10 == 1) {
        this->_nextState = HIGH;
        SVar5 = HIGH;
        goto LAB_00135172;
      }
      if (numMiddle == 1) {
        this->_nextState = MIDDLE;
        SVar5 = MIDDLE;
        goto LAB_00135172;
      }
    }
    this->_nextState = LOW;
    SVar5 = LOW;
    goto LAB_00135172;
  case 1:
    SVar5 = _findNextStateBuffer(this,adjacentStates,numInputs,uVar10,numMiddle);
    this->_nextState = SVar5;
    goto LAB_00135172;
  case 2:
    SVar5 = _findNextStateBuffer(this,adjacentStates,numInputs,uVar10,numMiddle);
    if (SVar5 == LOW) goto LAB_0013516c;
    if (SVar5 == HIGH) break;
    goto LAB_0013516f;
  case 3:
    if (1 < (int)numInputs) {
      if (uVar10 == numInputs) goto LAB_0013516c;
      if (numMiddle + uVar10 == numInputs) goto LAB_0013514c;
    }
    break;
  case 4:
    if (1 < (int)numInputs) {
      if (uVar10 == numInputs) break;
      if (numMiddle + uVar10 == numInputs) goto LAB_0013514c;
    }
    goto LAB_0013516c;
  case 5:
    if (1 < (int)numInputs) {
      if (0 < (int)uVar10) goto LAB_0013516c;
      if (0 < numMiddle) goto LAB_0013514c;
    }
    break;
  case 6:
    if (1 < (int)numInputs) {
      if (0 < (int)uVar10) break;
      if (0 < numMiddle) goto LAB_0013514c;
    }
    goto LAB_0013516c;
  case 7:
    if (1 < (int)numInputs) {
      if (numMiddle != 0) {
LAB_0013514c:
        SVar5 = MIDDLE;
        goto LAB_0013516f;
      }
      if ((uVar10 & 0x80000001) == 1) goto LAB_0013516c;
    }
    break;
  case 8:
    if (1 < (int)numInputs) {
      if (numMiddle != 0) goto LAB_0013516f;
      if ((uVar10 & 0x80000001) == 1) break;
    }
LAB_0013516c:
    SVar5 = HIGH;
    goto LAB_0013516f;
  default:
    SVar5 = this->_nextState;
    goto LAB_00135172;
  }
  SVar5 = LOW;
LAB_0013516f:
  this->_nextState = SVar5;
LAB_00135172:
  return SVar5 != this->_state;
}

Assistant:

bool TileGate::updateNextState() {
    State adjacentStates[4];
    adjacentStates[0] = getPosition().y > 0 ? getBoardPtr()->getTile(Vector2u(getPosition().x, getPosition().y - 1))->checkOutput(NORTH) : DISCONNECTED;
    adjacentStates[1] = getPosition().x < getBoardPtr()->getSize().x - 1 ? getBoardPtr()->getTile(Vector2u(getPosition().x + 1, getPosition().y))->checkOutput(EAST) : DISCONNECTED;
    adjacentStates[2] = getPosition().y < getBoardPtr()->getSize().y - 1 ? getBoardPtr()->getTile(Vector2u(getPosition().x, getPosition().y + 1))->checkOutput(SOUTH) : DISCONNECTED;
    adjacentStates[3] = getPosition().x > 0 ? getBoardPtr()->getTile(Vector2u(getPosition().x - 1, getPosition().y))->checkOutput(WEST) : DISCONNECTED;
    
    int numInputs = 0, numHigh = 0, numMiddle = 0;
    for (int i = 0; i < 4; ++i) {
        if (i != _direction && adjacentStates[i] != DISCONNECTED) {
            ++numInputs;
            if (adjacentStates[i] == HIGH) {
                ++numHigh;
            } else if (adjacentStates[i] == MIDDLE) {
                ++numMiddle;
            }
        }
    }
    if (!Board::enableExtraLogicStates) {
        numMiddle = 0;
    }
    if (_connectorChange) {
        _rightConnector = (adjacentStates[(_direction + 1) % 4] != DISCONNECTED);
        _leftConnector = (adjacentStates[(_direction + 3) % 4] != DISCONNECTED);
        if (_type < AND && _rightConnector && _leftConnector) {
            _rightConnector = false;
            _leftConnector = false;
        }
        _connectorChange = false;
        addUpdate(true);
    }
    
    if (_type == DIODE) {
        if (numInputs == 1) {
            if (numHigh == 1) {
                _nextState = HIGH;
            } else if (numMiddle == 1) {
                _nextState = MIDDLE;
            } else {
                _nextState = LOW;
            }
        } else {
            _nextState = LOW;
        }
    } else if (_type == BUFFER) {
        _nextState = _findNextStateBuffer(adjacentStates, numInputs, numHigh, numMiddle);
    } else if (_type == NOT) {
        _nextState = _complementState(_findNextStateBuffer(adjacentStates, numInputs, numHigh, numMiddle));
    } else if (_type == AND) {
        _nextState = _findNextStateAND(adjacentStates, numInputs, numHigh, numMiddle);
    } else if (_type == NAND) {
        _nextState = _complementState(_findNextStateAND(adjacentStates, numInputs, numHigh, numMiddle));
    } else if (_type == OR) {
        _nextState = _findNextStateOR(adjacentStates, numInputs, numHigh, numMiddle);
    } else if (_type == NOR) {
        _nextState = _complementState(_findNextStateOR(adjacentStates, numInputs, numHigh, numMiddle));
    } else if (_type == XOR) {
        _nextState = _findNextStateXOR(adjacentStates, numInputs, numHigh, numMiddle);
    } else if (_type == XNOR) {
        _nextState = _complementState(_findNextStateXOR(adjacentStates, numInputs, numHigh, numMiddle));
    }
    
    //cout << "Gate at (" << getPosition().x << ", " << getPosition().y << ") checked for state change:" << endl;
    //cout << "  aS = [" << adjacentStates[0] << ", " << adjacentStates[1] << ", " << adjacentStates[2] << ", " << adjacentStates[3] << "]" << endl;
    //cout << "  state = " << _state << ", next = " << _nextState << endl;
    
    return _nextState != _state;
}